

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_ext.hpp
# Opt level: O0

void detail::for_each_type<$44e1f2a7$>::execute(string *paramName)

{
  bool bVar1;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  SourceLineInfo local_118;
  SectionInfo local_108;
  Section local_b8;
  Section *local_18;
  Section *catch_internal_Section0;
  string *paramName_local;
  
  catch_internal_Section0 = (Section *)paramName;
  Catch::SourceLineInfo::SourceLineInfo
            (&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/test/include/catch_ext.hpp"
             ,0x31);
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 catch_internal_Section0,"=");
  __rhs = std::type_info::name
                    ((type_info *)
                     &custom::
                      AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>
                      ::typeinfo);
  std::operator+(&local_138,&local_158,__rhs);
  Catch::SectionInfo::SectionInfo(&local_108,&local_118,&local_138);
  Catch::Section::Section(&local_b8,&local_108);
  Catch::SectionInfo::~SectionInfo(&local_108);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  local_18 = &local_b8;
  bVar1 = Catch::Section::operator_cast_to_bool(local_18);
  if (bVar1) {
    ____C_A_T_C_H____T_E_S_T___E_X_T_E_N_S_I_O_N____64<custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
    ::execute();
  }
  Catch::Section::~Section(&local_b8);
  for_each_type<$f8c07d52$>::execute((string *)catch_internal_Section0);
  return;
}

Assistant:

static void execute(const std::string& paramName)
  {

    SECTION(paramName + "=" + typeid(T).name()) { Func<T>::execute(); }
    for_each_type<Func, Ts...>::execute(paramName);
  }